

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall HighsCutGeneration::separateLiftedMixedBinaryCover(HighsCutGeneration *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  long in_RDI;
  double dVar7;
  HighsCDouble HVar8;
  HighsInt i_2;
  anon_class_24_3_b8691072 phi;
  HighsInt i_1;
  HighsInt p;
  HighsCDouble sum;
  HighsInt i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coverflag;
  vector<double,_std::allocator<double>_> S;
  HighsInt coversize;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffea8;
  HighsCDouble *in_stack_fffffffffffffeb0;
  HighsCDouble *in_stack_fffffffffffffeb8;
  double *pdVar9;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffec0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  HighsCutGeneration *local_d8;
  int local_cc;
  HighsCDouble local_c8;
  undefined1 *local_b8;
  vector<double,_std::allocator<double>_> *local_b0;
  HighsCDouble local_a0;
  int iVar10;
  int iVar11;
  int iVar12;
  anon_class_24_3_b8691072 *in_stack_ffffffffffffff78;
  int local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<double,_std::allocator<double>_> local_30;
  int local_14;
  byte local_1;
  
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  *(undefined1 *)(in_RDI + 0xe1) = 0;
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18));
  local_14 = (int)sVar2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x58bb2c);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0._M_current,
             (size_type)in_stack_fffffffffffffec8._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x58bb52);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffed0._M_current,(size_type)in_stack_fffffffffffffec8._M_current);
  if (local_14 == 0) {
    local_1 = 0;
  }
  else {
    for (local_60 = 0; local_60 != local_14; local_60 = local_60 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)local_60);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_58,(long)*pvVar3);
      *pvVar4 = '\x01';
    }
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffea8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffea8);
    pdqsort_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedBinaryCover()::__0>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff78,0.0);
    iVar11 = local_14;
    for (iVar10 = 0; iVar12 = iVar11, iVar10 != local_14; iVar10 = iVar10 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)iVar10);
      HVar8 = ::operator-((double)in_stack_fffffffffffffec0.this,in_stack_fffffffffffffeb8);
      local_a0 = HVar8;
      bVar1 = HighsCDouble::operator<=(in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
      iVar12 = iVar10;
      if (bVar1) break;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)iVar10);
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_fffffffffffffec0.this,(double)in_stack_fffffffffffffeb8);
      dVar7 = HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xffffffffffffff78);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,(long)iVar10);
      *pvVar5 = dVar7;
    }
    if (iVar12 == 0) {
      local_1 = 0;
    }
    else {
      local_b8 = &stack0xffffffffffffff74;
      local_b0 = &local_30;
      local_c8 = HighsCDouble::operator-((HighsCDouble *)0x58be49);
      *(HighsCDouble *)(in_RDI + 0xd0) = local_c8;
      *(undefined1 *)(in_RDI + 0xe1) = 0;
      *(undefined1 *)(in_RDI + 0xe0) = 1;
      for (local_cc = 0; local_cc != *(int *)(in_RDI + 0xe4); local_cc = local_cc + 1) {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98)
                            ,(long)local_cc);
        if (*pvVar4 == '\0') {
          pdVar9 = (double *)(*(long *)(in_RDI + 0xc0) + (long)local_cc * 8);
          if (0.0 < *pdVar9 || *pdVar9 == 0.0) {
            *(undefined8 *)(*(long *)(in_RDI + 0xc0) + (long)local_cc * 8) = 0;
          }
          else {
            *(undefined1 *)(in_RDI + 0xe0) = 0;
          }
        }
        else {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_58,(long)local_cc);
          if (*pvVar4 == '\0') {
            dVar7 = separateLiftedMixedBinaryCover::anon_class_24_3_b8691072::operator()
                              (in_stack_ffffffffffffff78,(double)CONCAT44(iVar12,iVar10));
            *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_cc * 8) = dVar7;
          }
          else {
            pdVar9 = (double *)(*(long *)(in_RDI + 0xc0) + (long)local_cc * 8);
            in_stack_fffffffffffffec0.this =
                 (HighsCutGeneration *)
                 HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0x40));
            local_d8 = in_stack_fffffffffffffec0.this;
            pdVar6 = std::min<double>(pdVar9,(double *)&local_d8);
            *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_cc * 8) = *pdVar6;
            HighsCDouble::operator+=((HighsCDouble *)in_stack_fffffffffffffec0.this,(double)pdVar9);
          }
        }
      }
      local_1 = 1;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffec0.this
            );
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0.this);
  return (bool)(local_1 & 1);
}

Assistant:

bool HighsCutGeneration::separateLiftedMixedBinaryCover() {
  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  HighsInt coversize = cover.size();
  std::vector<double> S;
  S.resize(coversize);
  std::vector<uint8_t> coverflag;
  coverflag.resize(rowlen);

  if (coversize == 0) return false;

  for (HighsInt i = 0; i != coversize; ++i) coverflag[cover[i]] = 1;

  pdqsort_branchless(cover.begin(), cover.end(),
                     [&](HighsInt a, HighsInt b) { return vals[a] > vals[b]; });
  HighsCDouble sum = 0;

  HighsInt p = coversize;
  for (HighsInt i = 0; i != coversize; ++i) {
    if (vals[cover[i]] - lambda <= epsilon) {
      p = i;
      break;
    }
    sum += vals[cover[i]];
    S[i] = double(sum);
  }
  if (p == 0) return false;
  /* define the lifting function */
  auto phi = [&](double a) {
    for (HighsInt i = 0; i < p; ++i) {
      if (a <= S[i] - lambda) return double(i * lambda);

      if (a <= S[i]) return double((i + 1) * lambda + (HighsCDouble(a) - S[i]));
    }

    return double(p * lambda + (HighsCDouble(a) - S[p - 1]));
  };

  rhs = -lambda;

  integralCoefficients = false;
  integralSupport = true;
  for (HighsInt i = 0; i != rowlen; ++i) {
    if (!isintegral[i]) {
      if (vals[i] < 0)
        integralSupport = false;
      else
        vals[i] = 0;
      continue;
    }

    if (coverflag[i]) {
      vals[i] = std::min(vals[i], double(lambda));
      rhs += vals[i];
    } else {
      vals[i] = phi(vals[i]);
    }
  }

  return true;
}